

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DancingNode.cpp
# Opt level: O2

DancingNode *
createToridolMatrix(vector<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
                    *Matrix,int nRow,int nCol,
                   vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                   *ProbMat,DancingNode *header)

{
  int *piVar1;
  pointer pvVar2;
  long lVar3;
  long lVar4;
  s_DancingNode *psVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  int j;
  size_type __n;
  uint uVar12;
  size_type __n_00;
  reference rVar13;
  
  uVar10 = 0;
  uVar7 = 0;
  if (0 < nCol) {
    uVar7 = (ulong)(uint)nCol;
  }
  do {
    if ((long)nRow < (long)uVar10) {
      psVar5 = (((Matrix->
                 super__Vector_base<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<s_DancingNode,_std::allocator<s_DancingNode>_>)._M_impl.
               super__Vector_impl_data._M_start;
      header->right = psVar5;
      header->left = psVar5 + (long)nCol + -1;
      psVar5->left = header;
      psVar5[(long)nCol + -1].right = header;
      return header;
    }
    for (__n = 0; __n != uVar7; __n = __n + 1) {
      rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((ProbMat->
                          super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + uVar10,__n);
      if ((*rVar13._M_p & rVar13._M_mask) != 0) {
        pvVar2 = (Matrix->
                 super__Vector_base<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar3 = *(long *)&(pvVar2->super__Vector_base<s_DancingNode,_std::allocator<s_DancingNode>_>
                          )._M_impl.super__Vector_impl_data;
        if (uVar10 != 0) {
          piVar1 = (int *)(lVar3 + 0x30 + __n * 0x38);
          *piVar1 = *piVar1 + 1;
        }
        lVar11 = __n * 0x38;
        lVar4 = *(long *)&pvVar2[uVar10].
                          super__Vector_base<s_DancingNode,_std::allocator<s_DancingNode>_>._M_impl;
        *(long *)(lVar4 + 0x20 + lVar11) = lVar3 + lVar11;
        *(int *)(lVar4 + 0x28 + lVar11) = (int)uVar10;
        *(int *)(lVar4 + 0x2c + lVar11) = (int)__n;
        uVar9 = __n & 0xffffffff;
        do {
          iVar8 = (int)uVar9;
          if ((int)uVar9 < 1) {
            iVar8 = nCol;
          }
          uVar12 = iVar8 - 1;
          uVar9 = (ulong)uVar12;
          rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((ProbMat->
                              super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar10,(long)(int)uVar12)
          ;
        } while ((__n != uVar9) && ((rVar13._M_mask & *rVar13._M_p) == 0));
        lVar3 = *(long *)&(Matrix->
                          super__Vector_base<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar10].
                          super__Vector_base<s_DancingNode,_std::allocator<s_DancingNode>_>._M_impl.
                          super__Vector_impl_data;
        *(long *)(lVar3 + lVar11) = (long)(int)uVar12 * 0x38 + lVar3;
        uVar9 = __n & 0xffffffff;
        do {
          uVar6 = (long)((int)uVar9 + 1) % (long)nCol;
          uVar9 = uVar6 & 0xffffffff;
          __n_00 = (size_type)(int)uVar6;
          rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((ProbMat->
                              super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar10,__n_00);
          if (__n == uVar9) break;
        } while ((rVar13._M_mask & *rVar13._M_p) == 0);
        lVar3 = *(long *)&(Matrix->
                          super__Vector_base<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar10].
                          super__Vector_base<s_DancingNode,_std::allocator<s_DancingNode>_>._M_impl.
                          super__Vector_impl_data;
        *(size_type *)(lVar3 + 8 + lVar11) = __n_00 * 0x38 + lVar3;
        uVar9 = uVar10 & 0xffffffff;
        do {
          iVar8 = (int)uVar9;
          if ((int)uVar9 < 1) {
            iVar8 = nRow;
          }
          uVar12 = iVar8 - 1;
          uVar9 = (ulong)uVar12;
          rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((ProbMat->
                              super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + (int)uVar12,__n);
        } while ((uVar10 != uVar9) && ((rVar13._M_mask & *rVar13._M_p) == 0));
        pvVar2 = (Matrix->
                 super__Vector_base<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        *(long *)(*(long *)&pvVar2[uVar10].
                            super__Vector_base<s_DancingNode,_std::allocator<s_DancingNode>_>.
                            _M_impl.super__Vector_impl_data + 0x10 + lVar11) =
             *(long *)&pvVar2[(int)uVar12].
                       super__Vector_base<s_DancingNode,_std::allocator<s_DancingNode>_>._M_impl.
                       super__Vector_impl_data + lVar11;
        uVar9 = uVar10 & 0xffffffff;
        do {
          uVar9 = (long)((int)uVar9 + 1) % (long)nRow;
          iVar8 = (int)uVar9;
          uVar9 = uVar9 & 0xffffffff;
          rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((ProbMat->
                              super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + iVar8,__n);
          if (uVar10 == uVar9) break;
        } while ((rVar13._M_mask & *rVar13._M_p) == 0);
        pvVar2 = (Matrix->
                 super__Vector_base<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        *(long *)(*(long *)&pvVar2[uVar10].
                            super__Vector_base<s_DancingNode,_std::allocator<s_DancingNode>_>.
                            _M_impl.super__Vector_impl_data + 0x18 + lVar11) =
             *(long *)&pvVar2[iVar8].
                       super__Vector_base<s_DancingNode,_std::allocator<s_DancingNode>_>._M_impl.
                       super__Vector_impl_data + lVar11;
      }
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

DancingNode *createToridolMatrix(vector<vector<DancingNode>> &Matrix, int nRow, int nCol, vector<vector<bool>> &ProbMat, DancingNode *header) 
{ 
    // One extra row for list header nodes 
    // for each column 
    for(int i = 0; i <= nRow; i++) 
    { 
        for(int j = 0; j < nCol; j++) 
        { 
            // If it's 1 in the problem matrix then  
            // only create a node  
            if(ProbMat[i][j]) 
            {   
                int a, b; 
                //Matrix[i].push_back(DancingNode()); 
                // If it's 1, other than 1 in 0th row 
                // then count it as node of column  
                // and increment node count in column header 
                if(i) Matrix[0][j].nodeCount += 1; 
  
                // Add pointer to column header for this  
                // column node 
                Matrix[i][j].column = &Matrix[0][j]; 
  
                // set row and column id of this node 
                Matrix[i][j].row = i; 
                Matrix[i][j].col = j; 
  
                // Link the node with neighbors 
                // Left pointer 
                a = i; b = j; 
                do{ b = getLeft(b, nCol); } while(!ProbMat[a][b] && b != j); 
                Matrix[i][j].left = &Matrix[i][b]; 
                
                // Right pointer 
                a = i; b = j; 
                do { b = getRight(b, nCol); } while(!ProbMat[a][b] && b != j); 
                Matrix[i][j].right = &Matrix[i][b]; 
                
                // Up pointer 
                a = i; b = j; 
                do { a = getUp(a, nRow); } while(!ProbMat[a][b] && a != i); 
                Matrix[i][j].up = &Matrix[a][j]; 
  
                // Down pointer 
                a = i; b = j; 
                do { a = getDown(a, nRow); } while(!ProbMat[a][b] && a != i); 
                Matrix[i][j].down = &Matrix[a][j]; 
                
            } 
        } 
    } 
  
    // link header right pointer to column  
    // header of first column  
    header->right = &Matrix[0][0]; 
  
    // link header left pointer to column  
    // header of last column  
    header->left = &Matrix[0][nCol-1]; 
  
    Matrix[0][0].left = header; 
    Matrix[0][nCol-1].right = header; 
    return header; 
}